

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
FeaturesTest_InvalidFieldNonPackableWithPackedRepeatedEncoding_Test::
~FeaturesTest_InvalidFieldNonPackableWithPackedRepeatedEncoding_Test
          (FeaturesTest_InvalidFieldNonPackableWithPackedRepeatedEncoding_Test *this)

{
  FeaturesTest_InvalidFieldNonPackableWithPackedRepeatedEncoding_Test *this_local;
  
  ~FeaturesTest_InvalidFieldNonPackableWithPackedRepeatedEncoding_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, InvalidFieldNonPackableWithPackedRepeatedEncoding) {
  BuildDescriptorMessagesInTestPool();
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        message_type {
          name: "Foo"
          field {
            name: "bar"
            number: 1
            label: LABEL_REPEATED
            type: TYPE_STRING
            options { features { repeated_field_encoding: PACKED } }
          }
        }
      )pb",
      "foo.proto: Foo.bar: NAME: Only repeated primitive fields can specify "
      "PACKED repeated field encoding.\n");
}